

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

string * __thiscall
minja::TemplateToken::typeToString_abi_cxx11_
          (string *__return_storage_ptr__,TemplateToken *this,Type t)

{
  char *__s;
  allocator<char> local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "text";
    break;
  case 1:
    __s = "expression";
    break;
  case 2:
    __s = "if";
    break;
  case 3:
    __s = "else";
    break;
  case 4:
    __s = "elif";
    break;
  case 5:
    __s = "endif";
    break;
  case 6:
    __s = "for";
    break;
  case 7:
    __s = "endfor";
    break;
  case 8:
    __s = "generation";
    break;
  case 9:
    __s = "endgeneration";
    break;
  case 10:
    __s = "set";
    break;
  case 0xb:
    __s = "endset";
    break;
  case 0xc:
    __s = "comment";
    break;
  case 0xd:
    __s = "macro";
    break;
  case 0xe:
    __s = "endmacro";
    break;
  case 0xf:
    __s = "filter";
    break;
  case 0x10:
    __s = "endfilter";
    break;
  case 0x11:
    __s = "break";
    break;
  case 0x12:
    __s = "continue";
    break;
  default:
    __s = "Unknown";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

static std::string typeToString(Type t) {
        switch (t) {
            case Type::Text: return "text";
            case Type::Expression: return "expression";
            case Type::If: return "if";
            case Type::Else: return "else";
            case Type::Elif: return "elif";
            case Type::EndIf: return "endif";
            case Type::For: return "for";
            case Type::EndFor: return "endfor";
            case Type::Set: return "set";
            case Type::EndSet: return "endset";
            case Type::Comment: return "comment";
            case Type::Macro: return "macro";
            case Type::EndMacro: return "endmacro";
            case Type::Filter: return "filter";
            case Type::EndFilter: return "endfilter";
            case Type::Generation: return "generation";
            case Type::EndGeneration: return "endgeneration";
            case Type::Break: return "break";
            case Type::Continue: return "continue";
        }
        return "Unknown";
    }